

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<wchar_t>::RemoveIndex(Value<wchar_t> *this,SizeT index)

{
  bool bVar1;
  SizeT SVar2;
  Value<wchar_t> *pVVar3;
  SizeT index_local;
  Value<wchar_t> *this_local;
  
  bVar1 = isObject(this);
  if (bVar1) {
    HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
    ::RemoveIndex((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                   *)this,index);
  }
  else {
    bVar1 = isArray(this);
    if ((bVar1) &&
       (SVar2 = Array<Qentem::Value<wchar_t>_>::Size((Array<Qentem::Value<wchar_t>_> *)this),
       index < SVar2)) {
      pVVar3 = Array<Qentem::Value<wchar_t>_>::Storage((Array<Qentem::Value<wchar_t>_> *)this);
      Reset(pVVar3 + index);
    }
  }
  return;
}

Assistant:

void RemoveIndex(SizeT index) const noexcept {
        if (isObject()) {
            object_.RemoveIndex(index);
        } else if (isArray() && (index < array_.Size())) {
            (array_.Storage() + index)->Reset();
        }
    }